

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

bool __thiscall Character::DelTradeItem(Character *this,short item)

{
  list<Character_Item,_std::allocator<Character_Item>_> *this_00;
  const_iterator __position;
  
  this_00 = &this->trade_inventory;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) goto LAB_0011104e;
  } while (*(short *)&__position._M_node[1]._M_next != item);
  std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::erase(this_00,__position);
  CheckQuestRules(this);
LAB_0011104e:
  return __position._M_node != (_List_node_base *)this_00;
}

Assistant:

bool Character::DelTradeItem(short item)
{
	for (std::list<Character_Item>::iterator it = this->trade_inventory.begin(); it != this->trade_inventory.end(); ++it)
	{
		if (it->id == item)
		{
			this->trade_inventory.erase(it);
			this->CheckQuestRules();
			return true;
		}
	}

	return false;
}